

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void __thiscall
duckdb_parquet::FileCryptoMetaData::~FileCryptoMetaData(FileCryptoMetaData *this,void **vtt)

{
  void *pvVar1;
  pointer pcVar2;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x30)) = vtt[1];
  pcVar2 = (this->key_metadata)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->key_metadata).field_2) {
    operator_delete(pcVar2);
  }
  *(undefined ***)&this->encryption_algorithm = &PTR__EncryptionAlgorithm_0049d830;
  AesGcmCtrV1::~AesGcmCtrV1(&(this->encryption_algorithm).AES_GCM_CTR_V1,&AesGcmCtrV1::VTT);
  AesGcmV1::~AesGcmV1(&(this->encryption_algorithm).AES_GCM_V1,&AesGcmV1::VTT);
  return;
}

Assistant:

FileCryptoMetaData::~FileCryptoMetaData() noexcept {
}